

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void __thiscall
TPZAnalysis::DefineGraphMesh
          (TPZAnalysis *this,int dim,set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *tensnames,string *plotfile)

{
  size_type sVar1;
  int iVar2;
  ostream *poVar3;
  TPZDXGraphMesh *this_00;
  
  if ((this->fCompMesh != (TPZCompMesh *)0x0) &&
     ((matids->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if (this->fGraphMesh[(long)dim + -1] != (TPZGraphMesh *)0x0) {
      (*(this->fGraphMesh[(long)dim + -1]->super_TPZSavable)._vptr_TPZSavable[1])();
    }
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(this->fScalarNames + (long)dim + -1,scalnames);
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(this->fScalarNames + (long)dim + 2,vecnames);
    iVar2 = std::__cxx11::string::rfind((char *)plotfile,0x15665ad,0xffffffffffffffff);
    sVar1 = plotfile->_M_string_length;
    if (sVar1 - (long)iVar2 == 3) {
      if (tensnames->fNElements != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Tensors are not beint post-process for file = ",0x2e);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(plotfile->_M_dataplus)._M_p,
                            plotfile->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      this_00 = (TPZDXGraphMesh *)operator_new(0x538);
      TPZV3DGraphMesh::TPZV3DGraphMesh
                ((TPZV3DGraphMesh *)this_00,this->fCompMesh,dim,matids,scalnames,vecnames);
    }
    else {
      iVar2 = std::__cxx11::string::rfind((char *)plotfile,0x1567ebe,0xffffffffffffffff);
      if (sVar1 - (long)iVar2 == 3) {
        if (tensnames->fNElements != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Tensors are not beint post-process for file = ",0x2e);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(plotfile->_M_dataplus)._M_p,
                              plotfile->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        this_00 = (TPZDXGraphMesh *)operator_new(0x6e0);
        TPZDXGraphMesh::TPZDXGraphMesh(this_00,this->fCompMesh,dim,matids,scalnames,vecnames);
      }
      else {
        iVar2 = std::__cxx11::string::rfind((char *)plotfile,0x15665e1,0xffffffffffffffff);
        if (sVar1 - (long)iVar2 == 3) {
          if (tensnames->fNElements != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Tensors are not beint post-process for file = ",0x2e);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(plotfile->_M_dataplus)._M_p,
                                plotfile->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          this_00 = (TPZDXGraphMesh *)operator_new(0x510);
          TPZMVGraphMesh::TPZMVGraphMesh
                    ((TPZMVGraphMesh *)this_00,this->fCompMesh,dim,matids,scalnames,vecnames);
        }
        else {
          iVar2 = std::__cxx11::string::rfind((char *)plotfile,0x1531345,0xffffffffffffffff);
          if (sVar1 - (long)iVar2 != 4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"grafgrid was not created\n",0x19);
            this->fGraphMesh[(long)dim + -1] = (TPZGraphMesh *)0x0;
            return;
          }
          this_00 = (TPZDXGraphMesh *)operator_new(0x510);
          TPZVTKGraphMesh::TPZVTKGraphMesh
                    ((TPZVTKGraphMesh *)this_00,this->fCompMesh,dim,matids,scalnames,vecnames,
                     tensnames);
        }
      }
    }
    this->fGraphMesh[(long)dim + -1] = &this_00->super_TPZGraphMesh;
    (*(this_00->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable[0xe])(this_00,plotfile);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TPZAnalysis::DefineGraphMesh nothing to post-process\n",0x35);
  return;
}

Assistant:

void TPZAnalysis::DefineGraphMesh(int dim, const std::set<int> & matids , const TPZVec<std::string> &scalnames, const TPZVec<std::string> &vecnames, const TPZVec<std::string> &tensnames, const std::string &plotfile) {

    int dim1 = dim - 1;
    if (!fCompMesh || matids.size() == 0) {
        cout << "TPZAnalysis::DefineGraphMesh nothing to post-process\n";
        return;
    }

    if (fGraphMesh[dim1]) delete fGraphMesh[dim1];
    fScalarNames[dim1] = scalnames;
    fVectorNames[dim1] = vecnames;
    int posplot = plotfile.rfind(".plt");
    int64_t filelength = plotfile.size();
    if (filelength - posplot == 3) {
        if(tensnames.size() != 0)
        {
            std::cout << "Tensors are not beint post-process for file = " << plotfile << std::endl;
        }
        fGraphMesh[dim1] = new TPZV3DGraphMesh(fCompMesh, dim, matids, scalnames, vecnames);
    } else {
        int posdx = plotfile.rfind(".dx");
        if (filelength - posdx == 3) {
            if(tensnames.size() != 0) {
                std::cout << "Tensors are not beint post-process for file = " << plotfile << std::endl;
                
            }
            fGraphMesh[dim1] = new TPZDXGraphMesh(fCompMesh, dim, matids, scalnames, vecnames);
        } else {
            int pospos = plotfile.rfind(".pos");
            if (filelength - pospos == 3) {
                if(tensnames.size() != 0) {
                    std::cout << "Tensors are not beint post-process for file = " << plotfile << std::endl;
                }
                fGraphMesh[dim1] = new TPZMVGraphMesh(fCompMesh, dim, matids, scalnames, vecnames);
            } else {
                int posvtk = plotfile.rfind(".vtk");
                if (filelength - posvtk == 4) {
                    fGraphMesh[dim1] = new TPZVTKGraphMesh(fCompMesh, dim, matids, scalnames, vecnames, tensnames);
                } else {
                    cout << "grafgrid was not created\n";
                    fGraphMesh[dim1] = 0;
                }
            }
        }
    }
    if (fGraphMesh[dim1]) {
        fGraphMesh[dim1]->SetFileName(plotfile);
    }
}